

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_NtkMissingFonNames(Cba_Ntk_t *p,char *pPref)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iFon;
  int iObj;
  int i;
  char *pPref_local;
  Cba_Ntk_t *p_local;
  
  for (iFon = 0; iVar1 = Cba_NtkPiNum(p), iFon < iVar1; iFon = iFon + 1) {
    iVar1 = Cba_NtkPi(p,iFon);
    iVar2 = Cba_ObjFon0(p,iVar1);
    iVar3 = Cba_FonName(p,iVar2);
    if (iVar3 == 0) {
      iVar1 = Cba_ObjName(p,iVar1);
      Cba_FonSetName(p,iVar2,iVar1);
    }
  }
  for (iFon = 0; iVar1 = Cba_NtkPoNum(p), iFon < iVar1; iFon = iFon + 1) {
    iVar1 = Cba_NtkPo(p,iFon);
    iVar2 = Cba_ObjFinFon(p,iVar1,0);
    iVar3 = Cba_FonIsReal(iVar2);
    if ((iVar3 != 0) && (iVar3 = Cba_FonName(p,iVar2), iVar3 == 0)) {
      iVar1 = Cba_ObjName(p,iVar1);
      Cba_FonSetName(p,iVar2,iVar1);
    }
  }
  Cba_NtkAddMissingFonNames(p,pPref);
  return;
}

Assistant:

static inline void Cba_NtkMissingFonNames( Cba_Ntk_t * p, char * pPref )
{
    int i, iObj, iFon;//, NameId;
    Cba_NtkForEachPiFon( p, iObj, iFon, i )
        if ( !Cba_FonName(p, iFon) )
            Cba_FonSetName( p, iFon, Cba_ObjName(p, iObj) );
    Cba_NtkForEachPoDriverFon( p, iObj, iFon, i )
        if ( Cba_FonIsReal(iFon) && !Cba_FonName(p, iFon) )
            Cba_FonSetName( p, iFon, Cba_ObjName(p, iObj) );
//    Vec_IntForEachEntryStart( &p->vFonName, NameId, iFon, 1 )
//        if ( NameId == 0 )
//            Cba_FonSetName( p, iFon, Cba_NtkNewStrId(p, "%s%d", pPref, iFon) );
    Cba_NtkAddMissingFonNames( p, pPref );
}